

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

lysp_node_grp * lysp_node_groupings(lysp_node *node)

{
  uint16_t uVar1;
  long lStack_8;
  
  uVar1 = node->nodetype;
  lStack_8 = 0x60;
  if ((uVar1 != 1) && (uVar1 != 0x10)) {
    if ((uVar1 != 0x100) && (uVar1 != 0x200)) {
      if (((uVar1 == 0x400) || (uVar1 == 0x1000)) || (uVar1 == 0x2000)) {
        lStack_8 = 0x50;
        goto LAB_0015c51c;
      }
      if (uVar1 != 0x4000) {
        return (lysp_node_grp *)0x0;
      }
    }
    lStack_8 = 0x48;
  }
LAB_0015c51c:
  return *(lysp_node_grp **)((long)&node->parent + lStack_8);
}

Assistant:

lysp_node_grp *
lysp_node_groupings(const struct lysp_node *node)
{
    switch (node->nodetype) {
    case LYS_CONTAINER:
        return ((struct lysp_node_container *)node)->groupings;
    case LYS_LIST:
        return ((struct lysp_node_list *)node)->groupings;
    case LYS_GROUPING:
        return ((struct lysp_node_grp *)node)->groupings;
    case LYS_RPC:
    case LYS_ACTION:
        return ((struct lysp_node_action *)node)->groupings;
    case LYS_INPUT:
    case LYS_OUTPUT:
        return ((struct lysp_node_action_inout *)node)->groupings;
    case LYS_NOTIF:
        return ((struct lysp_node_notif *)node)->groupings;
    default:
        return NULL;
    }
}